

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

vector<int,_std::allocator<int>_> * cppqc::shrinkIntegral<int>(int x)

{
  int iVar1;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int n;
  vector<int,_std::allocator<int>_> *ret;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  vector<int,_std::allocator<int>_> *this;
  
  this = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3f1514);
  if (in_ESI < 0) {
    in_stack_ffffffffffffffbc = in_ESI;
    iVar1 = std::numeric_limits<int>::min();
    if (in_stack_ffffffffffffffbc == iVar1) {
      std::numeric_limits<int>::max();
      std::vector<int,_std::allocator<int>_>::push_back
                (this,(value_type_conflict6 *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    else {
      if (-in_ESI < 1) {
        __assert_fail("-x > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/include/cppqc/Arbitrary.h"
                      ,0x9c,"std::vector<Integral> cppqc::shrinkIntegral(Integral) [Integral = int]"
                     );
      }
      std::vector<int,_std::allocator<int>_>::push_back
                (this,(value_type_conflict6 *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
  }
  for (; in_ESI != 0; in_ESI = in_ESI / 2) {
    std::vector<int,_std::allocator<int>_>::push_back
              (this,(value_type_conflict6 *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return in_RDI;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}